

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void idtx32x32_avx2(__m256i *input,__m256i *output,int8_t cos_bit,int instride,int outstride)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  __m256i alVar4;
  
  lVar1 = (long)outstride;
  lVar2 = (long)instride;
  for (uVar3 = 0; uVar3 < 0x20; uVar3 = uVar3 + 8) {
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])*input,2);
    *output = alVar4;
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])input[lVar2],2);
    output[lVar1] = alVar4;
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])input[lVar2 * 2],2);
    output[lVar1 * 2] = alVar4;
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])input[lVar2 * 3],2);
    output[lVar1 * 3] = alVar4;
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])input[lVar2 * 4],2);
    output[lVar1 * 4] = alVar4;
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])input[lVar2 * 5],2);
    output[lVar1 * 5] = alVar4;
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])input[lVar2 * 6],2);
    output[lVar1 * 6] = alVar4;
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])input[lVar2 * 7],2);
    output[lVar1 * 7] = alVar4;
    input = input + lVar2 * 8;
    output = output + lVar1 * 8;
  }
  return;
}

Assistant:

static inline void idtx32x32_avx2(__m256i *input, __m256i *output,
                                  const int8_t cos_bit, int instride,
                                  int outstride) {
  (void)cos_bit;
  for (int i = 0; i < 32; i += 8) {
    output[i * outstride] = _mm256_slli_epi32(input[i * instride], 2);
    output[(i + 1) * outstride] =
        _mm256_slli_epi32(input[(i + 1) * instride], 2);
    output[(i + 2) * outstride] =
        _mm256_slli_epi32(input[(i + 2) * instride], 2);
    output[(i + 3) * outstride] =
        _mm256_slli_epi32(input[(i + 3) * instride], 2);
    output[(i + 4) * outstride] =
        _mm256_slli_epi32(input[(i + 4) * instride], 2);
    output[(i + 5) * outstride] =
        _mm256_slli_epi32(input[(i + 5) * instride], 2);
    output[(i + 6) * outstride] =
        _mm256_slli_epi32(input[(i + 6) * instride], 2);
    output[(i + 7) * outstride] =
        _mm256_slli_epi32(input[(i + 7) * instride], 2);
  }
}